

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O1

sexp_conflict
sexp_make_parameter(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict init,
                   sexp_conflict conv)

{
  sexp_conflict psVar1;
  sexp_conflict cell;
  sexp_gc_var_t __sexp_gc_preserver1;
  
  __sexp_gc_preserver1.var = &cell;
  cell = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &__sexp_gc_preserver1;
  cell = (sexp_conflict)sexp_cons_op(ctx,0,2,0x3e,init);
  psVar1 = (sexp_conflict)sexp_make_opcode(ctx,self,0x3e,0x15,0x29,1,3,1,1,1,cell,conv,0);
  (ctx->value).context.saves = __sexp_gc_preserver1.next;
  return psVar1;
}

Assistant:

sexp sexp_make_parameter (sexp ctx, sexp self, sexp_sint_t n, sexp init, sexp conv) {
  sexp res;
  sexp_gc_var1(cell);
  sexp_gc_preserve1(ctx, cell);
  cell = sexp_cons(ctx, SEXP_FALSE, init);
  res = sexp_make_opcode(ctx, self, SEXP_FALSE, _I(SEXP_OPC_PARAMETER),
                         _I(SEXP_OP_PARAMETER_REF), SEXP_ZERO, SEXP_ONE,
                         _I(SEXP_OBJECT), _I(SEXP_OBJECT), SEXP_ZERO,
                         cell, conv, NULL);
  sexp_gc_release1(ctx);
  return res;
}